

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getColName(void *highs,HighsInt col,char *name)

{
  HighsStatus HVar1;
  char *__src;
  char *in_RDX;
  HighsInt retcode;
  string name_v;
  string *name_00;
  HighsInt in_stack_ffffffffffffffb4;
  Highs *in_stack_ffffffffffffffb8;
  string local_38;
  char *local_18;
  
  name_00 = &local_38;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)name_00);
  HVar1 = Highs::getColName(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,name_00);
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(local_18,__src);
  std::__cxx11::string::~string((string *)&local_38);
  return HVar1;
}

Assistant:

HighsInt Highs_getColName(const void* highs, const HighsInt col, char* name) {
  std::string name_v;
  HighsInt retcode = (HighsInt)((Highs*)highs)->getColName(col, name_v);
  strcpy(name, name_v.c_str());
  return retcode;
}